

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCheck.c
# Opt level: O3

int cuddHeapProfile(DdManager *dd)

{
  uint uVar1;
  DdSubtable *pDVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint *puVar9;
  uint local_44;
  
  uVar1 = dd->size;
  pDVar2 = dd->subtables;
  uVar8 = 0;
  iVar3 = fprintf((FILE *)dd->out,"*** DD heap profile for 0x%lx ***\n");
  if (iVar3 != -1) {
    if ((int)uVar1 < 1) {
      uVar6 = 0;
      uVar4 = 0xffffffff;
      local_44 = 0xffffffff;
    }
    else {
      puVar9 = &pDVar2->dead;
      local_44 = 0xffffffff;
      uVar7 = 0;
      uVar6 = 0;
      uVar5 = 0xffffffff;
      do {
        uVar8 = puVar9[-2] - *puVar9;
        if (uVar8 != 0) {
          iVar3 = fprintf((FILE *)dd->out,"%5d: %5d nodes\n",uVar7 & 0xffffffff,(ulong)uVar8);
          if (iVar3 == -1) {
            return 0;
          }
          uVar6 = uVar6 + 1;
          if ((int)local_44 < (int)uVar8) {
            uVar5 = uVar7 & 0xffffffff;
            local_44 = uVar8;
          }
        }
        uVar4 = (uint)uVar5;
        uVar7 = uVar7 + 1;
        puVar9 = puVar9 + 0xe;
      } while (uVar1 != uVar7);
    }
    uVar8 = (dd->constants).keys - (dd->constants).dead;
    if (uVar8 != 0) {
      iVar3 = fprintf((FILE *)dd->out,"const: %5d nodes\n",(ulong)uVar8);
      if (iVar3 == -1) {
        return 0;
      }
      uVar6 = uVar6 + 1;
      if ((int)local_44 < (int)uVar8) {
        uVar4 = 0x7fffffff;
        local_44 = uVar8;
      }
    }
    uVar8 = 0;
    iVar3 = fprintf((FILE *)dd->out,"Summary: %d tables, %d non-empty, largest: %d ",
                    (ulong)(uVar1 + 1),(ulong)uVar6,(ulong)uVar4);
    if (iVar3 != -1) {
      iVar3 = fprintf((FILE *)dd->out,"(with %d nodes)\n",(ulong)local_44);
      uVar8 = (uint)(iVar3 != -1);
    }
  }
  return uVar8;
}

Assistant:

int
cuddHeapProfile(
  DdManager * dd)
{
    int ntables = dd->size;
    DdSubtable *subtables = dd->subtables;
    int i,              /* loop index */
        nodes,          /* live nodes in i-th layer */
        retval,         /* return value of fprintf */
        largest = -1,   /* index of the table with most live nodes */
        maxnodes = -1,  /* maximum number of live nodes in a table */
        nonempty = 0;   /* number of tables with live nodes */

    /* Print header. */
#if SIZEOF_VOID_P == 8
    retval = fprintf(dd->out,"*** DD heap profile for 0x%lx ***\n",
                     (ptruint) dd);
#else
    retval = fprintf(dd->out,"*** DD heap profile for 0x%x ***\n",
                     (ptruint) dd);
#endif
    if (retval == EOF) return 0;

    /* Print number of live nodes for each nonempty table. */
    for (i=0; i<ntables; i++) {
        nodes = subtables[i].keys - subtables[i].dead;
        if (nodes) {
            nonempty++;
            retval = fprintf(dd->out,"%5d: %5d nodes\n", i, nodes);
            if (retval == EOF) return 0;
            if (nodes > maxnodes) {
                maxnodes = nodes;
                largest = i;
            }
        }
    }

    nodes = dd->constants.keys - dd->constants.dead;
    if (nodes) {
        nonempty++;
        retval = fprintf(dd->out,"const: %5d nodes\n", nodes);
        if (retval == EOF) return 0;
        if (nodes > maxnodes) {
            maxnodes = nodes;
            largest = CUDD_CONST_INDEX;
        }
    }

    /* Print summary. */
    retval = fprintf(dd->out,"Summary: %d tables, %d non-empty, largest: %d ",
          ntables+1, nonempty, largest);
    if (retval == EOF) return 0;
    retval = fprintf(dd->out,"(with %d nodes)\n", maxnodes);
    if (retval == EOF) return 0;

    return(1);

}